

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.hpp
# Opt level: O2

pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
* __thiscall
libtorrent::aux::peer_list::find_peers
          (pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
           *__return_storage_ptr__,peer_list *this,address *a)

{
  _Elt_pointer pptVar1;
  _Elt_pointer pptVar2;
  _Elt_pointer pptVar3;
  _Map_pointer ppptVar4;
  bool bVar5;
  _Elt_pointer local_78;
  _Elt_pointer pptStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  _Elt_pointer local_58;
  _Elt_pointer pptStack_50;
  _Elt_pointer local_48;
  _Map_pointer ppptStack_40;
  address local_38;
  
  local_38.ipv6_address_.addr_.__in6_u._8_8_ = 0;
  local_38.ipv6_address_.scope_id_ = 0;
  local_38.type_ = ipv4;
  local_38.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  local_38.ipv6_address_.addr_.__in6_u._0_8_ = 0;
  bVar5 = boost::asio::ip::operator==(a,&local_38);
  if (bVar5) {
    pptVar1 = (this->m_peers).
              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              .
              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pptVar2 = (this->m_peers).
              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              .
              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first;
    pptVar3 = (this->m_peers).
              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              .
              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last;
    ppptVar4 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    (__return_storage_ptr__->first)._M_cur = pptVar1;
    (__return_storage_ptr__->first)._M_first = pptVar2;
    (__return_storage_ptr__->first)._M_last = pptVar3;
    (__return_storage_ptr__->first)._M_node = ppptVar4;
    (__return_storage_ptr__->second)._M_cur = pptVar1;
    (__return_storage_ptr__->second)._M_first = pptVar2;
    (__return_storage_ptr__->second)._M_last = pptVar3;
    (__return_storage_ptr__->second)._M_node = ppptVar4;
  }
  else {
    local_58 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptStack_50 = (this->m_peers).
                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  .
                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first;
    local_48 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppptStack_40 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_78 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pptStack_70 = (this->m_peers).
                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  .
                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_68 = *(undefined4 *)
                &(this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_last;
    uStack_64 = *(undefined4 *)
                 ((long)&(this->m_peers).
                         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         .
                         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_last + 4);
    uStack_60 = *(undefined4 *)
                 &(this->m_peers).
                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  .
                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node;
    uStack_5c = *(undefined4 *)
                 ((long)&(this->m_peers).
                         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         .
                         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node + 4);
    ::std::
    equal_range<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,boost::asio::ip::address,libtorrent::aux::peer_address_compare>
              (__return_storage_ptr__,&local_58,&local_78,a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> find_peers(address const& a)
		{
#if TORRENT_USE_I2P
			if (a == address())
				return std::pair<iterator, iterator>(m_peers.end(), m_peers.end());
#endif
			return std::equal_range(
				m_peers.begin(), m_peers.end(), a, peer_address_compare());
		}